

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestSkip::Run(TestSkip *this)

{
  Outputter **__u;
  bool bVar1;
  pointer outputter;
  RunParams local_1698;
  undefined1 local_1678 [8];
  Results rs;
  string local_1658 [32];
  undefined1 local_1638 [8];
  TestSkipInternal myTestA;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> local_15f0;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> op;
  ostringstream local_15d8 [8];
  ostringstream oss;
  undefined1 local_1460 [8];
  TestRegistry r;
  TestSkip *this_local;
  
  r._5192_8_ = this;
  testinator::TestRegistry::TestRegistry((TestRegistry *)local_1460);
  std::__cxx11::ostringstream::ostringstream(local_15d8);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &myTestA.super_Test.m_op);
  __u = &myTestA.super_Test.m_op;
  std::unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>>::
  unique_ptr<testinator::DefaultOutputter,std::default_delete<testinator::DefaultOutputter>,void>
            ((unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>> *)
             &local_15f0,
             (unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
              *)__u);
  std::unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
  ::~unique_ptr((unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
                 *)__u);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1658,"A",
             (allocator *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  TestSkipInternal::TestSkipInternal
            ((TestSkipInternal *)local_1638,(TestRegistry *)local_1460,(string *)local_1658);
  std::__cxx11::string::~string(local_1658);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1698.m_flags = 0;
  local_1698._4_4_ = 0;
  local_1698.m_numPropertyChecks = 0;
  local_1698.m_randomSeed = 0;
  testinator::RunParams::RunParams(&local_1698);
  outputter = std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::
              get(&local_15f0);
  testinator::TestRegistry::RunAllTests
            ((Results *)local_1678,(TestRegistry *)local_1460,&local_1698,outputter);
  bVar1 = testinator::Test::skipped((Test *)local_1638);
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1678);
  TestSkipInternal::~TestSkipInternal((TestSkipInternal *)local_1638);
  std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::~unique_ptr
            (&local_15f0);
  std::__cxx11::ostringstream::~ostringstream(local_15d8);
  testinator::TestRegistry::~TestRegistry((TestRegistry *)local_1460);
  return bVar1;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);

    TestSkipInternal myTestA(r, "A");
    testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());

    return myTestA.skipped();
  }